

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>::operator()
          (bin_writer<1> *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it
          )

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  byte *pbVar5;
  size_t sVar6;
  long lVar7;
  byte bVar8;
  long lVar9;
  byte *pbVar10;
  ulong uVar11;
  byte abStack_59 [9];
  char buffer [66];
  
  pbVar5 = (byte *)(it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar6 = (it->super_truncating_iterator_base<char_*>).count_;
  bVar8 = it->blackhole_;
  iVar1 = *(int *)(this + 8);
  lVar7 = (long)iVar1;
  pbVar10 = abStack_59 + lVar7;
  uVar11 = *(ulong *)this;
  do {
    *pbVar10 = (byte)uVar11 & 1 | 0x30;
    pbVar10 = pbVar10 + -1;
    bVar3 = 1 < uVar11;
    uVar11 = uVar11 >> 1;
  } while (bVar3);
  if (0 < iVar1) {
    lVar9 = 0;
    do {
      bVar4 = abStack_59[lVar9 + 1];
      if (sVar6 + lVar9 < uVar2) {
        *pbVar5 = abStack_59[lVar9 + 1];
        pbVar5 = pbVar5 + 1;
        bVar4 = bVar8;
      }
      bVar8 = bVar4;
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
    sVar6 = sVar6 + lVar7;
  }
  (it->super_truncating_iterator_base<char_*>).out_ = (char *)pbVar5;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar6;
  it->blackhole_ = bVar8;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }